

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O3

void uv__write_req_finish(uv_write_t *req)

{
  uv_stream_t *puVar1;
  uv_stream_t *stream;
  uv_write_t *req_local;
  
  puVar1 = req->handle;
  uv__queue_remove(&req->queue);
  if (req->error == 0) {
    if (req->bufs != req->bufsml) {
      uv__free(req->bufs);
    }
    req->bufs = (uv_buf_t *)0x0;
  }
  uv__queue_insert_tail(&puVar1->write_completed_queue,&req->queue);
  uv__io_feed(puVar1->loop,&puVar1->io_watcher);
  return;
}

Assistant:

static void uv__write_req_finish(uv_write_t* req) {
  uv_stream_t* stream = req->handle;

  /* Pop the req off tcp->write_queue. */
  uv__queue_remove(&req->queue);

  /* Only free when there was no error. On error, we touch up write_queue_size
   * right before making the callback. The reason we don't do that right away
   * is that a write_queue_size > 0 is our only way to signal to the user that
   * they should stop writing - which they should if we got an error. Something
   * to revisit in future revisions of the libuv API.
   */
  if (req->error == 0) {
    if (req->bufs != req->bufsml)
      uv__free(req->bufs);
    req->bufs = NULL;
  }

  /* Add it to the write_completed_queue where it will have its
   * callback called in the near future.
   */
  uv__queue_insert_tail(&stream->write_completed_queue, &req->queue);
  uv__io_feed(stream->loop, &stream->io_watcher);
}